

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electromagnetic_Emission_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Electromagnetic_Emission_PDU::Electromagnetic_Emission_PDU
          (Electromagnetic_Emission_PDU *this,EntityIdentifier *EmittingID,EntityIdentifier *EventID
          ,StateUpdateIndicator SUI)

{
  KUINT16 KVar1;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Electromagnetic_Emission_PDU_002144c0;
  (this->m_EmittingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00216f20;
  KVar1 = (EmittingID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_EmittingEntityID).super_SimulationIdentifier.m_ui16SiteID =
       (EmittingID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_EmittingEntityID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_EmittingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00216bc0;
  *(undefined2 *)&(this->m_EmittingEntityID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(EmittingID->super_SimulationIdentifier).field_0xc;
  (this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00216f20;
  KVar1 = (EventID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_EventID).super_SimulationIdentifier.m_ui16SiteID =
       (EventID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_EventID).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00216bc0;
  *(undefined2 *)&(this->m_EventID).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(EventID->super_SimulationIdentifier).field_0xc;
  this->m_ui8StateUpdateIndicator = (KUINT8)SUI;
  this->m_ui8NumberOfEmissionSystems = '\0';
  this->m_ui16Padding = 0;
  (this->m_vEmissionSystem).
  super__Vector_base<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vEmissionSystem).
  super__Vector_base<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vEmissionSystem).
  super__Vector_base<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Header).super_Header6.m_ui8PDUType = '\x17';
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x06';
  (this->super_Header).super_Header6.m_ui16PDULength = 0x1c;
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x05';
  return;
}

Assistant:

Electromagnetic_Emission_PDU::Electromagnetic_Emission_PDU( const EntityIdentifier & EmittingID, const EntityIdentifier & EventID,
        StateUpdateIndicator SUI ) :
    m_EmittingEntityID( EmittingID ),
    m_EventID( EventID ),
    m_ui8StateUpdateIndicator( SUI ),
    m_ui8NumberOfEmissionSystems( 0 ),
    m_ui16Padding( 0 )
{
    m_ui8ProtocolFamily = Distributed_Emission_Regeneration;
    m_ui8PDUType = Electromagnetic_Emission_PDU_Type;
    m_ui16PDULength = ELECTROMAGNETIC_EMISSION_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1_1995;
}